

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

void __thiscall
CppCNN::backprop_conv
          (CppCNN *this,MatrixXd *delta_prev_fc,AllLayersValuesBatch *Z_batch,
          AllLayersValuesBatch *A_batch)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  Index IVar4;
  Index IVar5;
  size_type sVar6;
  long lVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *this_00;
  ImageVolume local_170;
  shared_ptr<LayerPool> local_158;
  __shared_ptr_access<LayerPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_148;
  shared_ptr<LayerPool> *layer_pool;
  undefined1 local_128 [8];
  LayerSize next_layer_size;
  value_type *img;
  __shared_ptr_access<LayerConv,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_f8;
  shared_ptr<LayerConv> *layer_conv;
  value_type *p_layer;
  int64_t i_1;
  ConstColXpr local_c8;
  undefined1 local_90 [8];
  VectorXd v_delta_prev_fc;
  int i;
  undefined1 local_70 [8];
  LayerSize lv_fc_sz;
  value_type *lv_fc;
  ImageVolume DeltaPrev;
  value_type *Z;
  value_type *A;
  AllLayersValuesBatch *A_batch_local;
  AllLayersValuesBatch *Z_batch_local;
  MatrixXd *delta_prev_fc_local;
  CppCNN *this_local;
  
  pvVar2 = std::
           vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
           ::back(A_batch);
  DeltaPrev.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
                ::back(Z_batch);
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
            *)&lv_fc);
  pvVar3 = std::
           vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
           ::operator[](pvVar2,0);
  lv_fc_sz._16_8_ =
       std::
       vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
       ::operator[](pvVar3,0);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)lv_fc_sz._16_8_);
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)lv_fc_sz._16_8_);
  pvVar3 = std::
           vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
           ::back(pvVar2);
  sVar6 = std::
          vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(pvVar3);
  Dimension::Dimension((Dimension *)local_70,IVar4,IVar5,(int)sVar6);
  for (v_delta_prev_fc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows._0_4_ = 0;
      lVar7 = (long)(int)v_delta_prev_fc.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&delta_prev_fc->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>),
      lVar7 < IVar4;
      v_delta_prev_fc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows._0_4_ = (int)v_delta_prev_fc.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)delta_prev_fc,
               (long)(int)v_delta_prev_fc.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
              ((Matrix<double,_1,1,0,_1,1> *)local_90,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                *)&local_c8);
    unflatten_layer((LayerValues *)&i_1,this,(VectorXd *)local_90,(LayerSize *)local_70);
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::push_back((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                 *)&lv_fc,(value_type *)&i_1);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&i_1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_90);
  }
  p_layer = (value_type *)
            std::vector<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>::
            size(&this->__layers);
  while (p_layer = (value_type *)
                   ((long)&p_layer[-1].super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7), -1 < (long)p_layer) {
    layer_conv = (shared_ptr<LayerConv> *)
                 std::
                 vector<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>::
                 operator[](&this->__layers,(size_type)p_layer);
    peVar8 = std::__shared_ptr_access<LayerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<LayerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       layer_conv);
    bVar1 = is_conv_layer(this,peVar8);
    if (bVar1) {
      std::dynamic_pointer_cast<LayerConv,LayerBase>((shared_ptr<LayerBase> *)&img);
      local_f8 = (__shared_ptr_access<LayerConv,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&img;
      peVar9 = std::__shared_ptr_access<LayerConv,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<LayerConv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&img);
      pvVar2 = std::
               vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
               ::operator[](A_batch,(size_type)p_layer);
      LayerConv::compute_gradients(peVar9,pvVar2,(ImageVolume *)&lv_fc);
      pvVar2 = std::
               vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
               ::operator[](Z_batch,(size_type)p_layer);
      pvVar3 = std::
               vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
               ::operator[](pvVar2,0);
      next_layer_size._16_8_ =
           std::
           vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
           ::operator[](pvVar3,0);
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         next_layer_size._16_8_);
      IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                         next_layer_size._16_8_);
      pvVar2 = std::
               vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
               ::operator[](Z_batch,(size_type)p_layer);
      pvVar3 = std::
               vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
               ::operator[](pvVar2,0);
      sVar6 = std::
              vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
              ::size(pvVar3);
      Dimension::Dimension((Dimension *)local_128,IVar4,IVar5,(int)sVar6);
      peVar9 = std::__shared_ptr_access<LayerConv,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_f8);
      pvVar2 = std::
               vector<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>_>_>
               ::operator[](Z_batch,(size_type)p_layer);
      LayerConv::convolution_backward
                ((ImageVolume *)&layer_pool,peVar9,(ImageVolume *)&lv_fc,pvVar2,
                 (LayerSize *)local_128);
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::operator=((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)&lv_fc,
                  (vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)&layer_pool);
      std::
      vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
      ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                 *)&layer_pool);
      std::shared_ptr<LayerConv>::~shared_ptr((shared_ptr<LayerConv> *)&img);
    }
    else {
      peVar8 = std::__shared_ptr_access<LayerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<LayerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                         )layer_conv);
      bVar1 = is_pool_layer(this,peVar8);
      if (bVar1) {
        std::dynamic_pointer_cast<LayerPool,LayerBase>((shared_ptr<LayerBase> *)&local_158);
        local_148 = (__shared_ptr_access<LayerPool,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &local_158;
        this_00 = std::__shared_ptr_access<LayerPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<LayerPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_158);
        LayerPool::unpool(&local_170,this_00,(ImageVolume *)&lv_fc);
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::operator=((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     *)&lv_fc,&local_170);
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::~vector(&local_170);
        std::shared_ptr<LayerPool>::~shared_ptr(&local_158);
      }
    }
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             *)&lv_fc);
  return;
}

Assistant:

void CppCNN::backprop_conv(const MatrixXd& delta_prev_fc, 
							 const AllLayersValuesBatch& Z_batch, const AllLayersValuesBatch& A_batch) {
	auto& A = A_batch.back();
	auto& Z = Z_batch.back();

	ImageVolume DeltaPrev;
	auto& lv_fc = A[0][0]; // one of layer values before fully-connected layer.
	auto lv_fc_sz = LayerSize(lv_fc.rows(), lv_fc.cols(), A.back().size());
	for (auto i = 0; i < delta_prev_fc.cols(); i++) {
		VectorXd v_delta_prev_fc = delta_prev_fc.col(i);
		DeltaPrev.push_back(unflatten_layer(v_delta_prev_fc, lv_fc_sz));
	}
	
	for (int64_t i = __layers.size() - 1; i >= 0; i--) {
		auto& p_layer = __layers[i];
		if (is_conv_layer(*p_layer)) {
			const auto& layer_conv = dynamic_pointer_cast<LayerConv>(p_layer);

			layer_conv->compute_gradients(A_batch[i], DeltaPrev);

			// compute next layer's dZ from current layer's dZ, direction : dZ^{l-1} <-- dZ^{l}
			auto& img = Z_batch[i][0][0];
			auto next_layer_size = LayerSize(img.rows(), img.cols(), Z_batch[i][0].size());
			DeltaPrev = layer_conv->convolution_backward(DeltaPrev, Z_batch[i], next_layer_size);
		}
		else if (is_pool_layer(*p_layer)) {
			const auto& layer_pool = dynamic_pointer_cast<LayerPool>(p_layer);
			DeltaPrev = layer_pool->unpool(DeltaPrev);
		}
	}
}